

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunction_Poly345.cpp
# Opt level: O3

double __thiscall chrono::ChFunction_Poly345::Get_y_dxdx(ChFunction_Poly345 *this,double x)

{
  double dVar1;
  double dVar2;
  undefined8 in_XMM0_Qb;
  undefined1 auVar3 [16];
  undefined1 auVar4 [64];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 extraout_var [56];
  
  dVar2 = 0.0;
  if ((0.0 < x) && (dVar1 = this->end, x < dVar1)) {
    auVar3._0_8_ = x / dVar1;
    auVar3._8_8_ = in_XMM0_Qb;
    dVar2 = this->h;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = auVar3._0_8_ * auVar3._0_8_ * -180.0;
    auVar5 = vfmadd231sd_fma(auVar5,auVar3,ZEXT816(0x404e000000000000));
    auVar6._0_8_ = auVar5._0_8_;
    auVar4._0_8_ = pow(auVar3._0_8_,3.0);
    auVar4._8_56_ = extraout_var;
    auVar6._8_8_ = 0;
    auVar5 = vfmadd132sd_fma(auVar4._0_16_,auVar6,ZEXT816(0x405e000000000000));
    dVar2 = auVar5._0_8_ * (1.0 / (dVar1 * dVar1)) * dVar2;
  }
  return dVar2;
}

Assistant:

double ChFunction_Poly345::Get_y_dxdx(double x) const {
    double ret = 0;
    if (x <= 0)
        return 0;
    if (x >= end)
        return 0;
    double a = x / end;
    ret = h * (1 / (end * end)) * (60 * a - 180 * pow(a, 2) + 120 * pow(a, 3));
    return ret;
}